

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::
FunctionMocker<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
PerformDefaultAction
          (FunctionMocker<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
           *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *this_00;
  pointer pcVar1;
  bool bVar2;
  Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *this_01;
  Result pEVar3;
  Result pEVar4;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  string message;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  _Head_base<0UL,_const_ot::commissioner::Address_&,_false> local_30;
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while (ppvVar5 !=
         (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
         super__Vector_impl_data._M_start) {
    this_00 = (OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
               *)ppvVar5[-1];
    ppvVar5 = ppvVar5 + -1;
    bVar2 = OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
            Matches(this_00,args);
    if (bVar2) {
      this_01 = OnCallSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
                ::GetAction(this_00);
      local_30._M_head_impl =
           (args->super__Tuple_impl<0UL,_const_ot::commissioner::Address_&>).
           super__Head_base<0UL,_const_ot::commissioner::Address_&,_false>._M_head_impl;
      pEVar3 = Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
               Perform(this_01,(ArgumentTuple *)&local_30);
      return pEVar3;
    }
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_50);
  if (DefaultValue<ot::commissioner::EnergyReport_const*>::producer_ == (long *)0x0) {
    pEVar4 = (Result)0x0;
  }
  else {
    pEVar4 = (Result)(**(code **)(*DefaultValue<ot::commissioner::EnergyReport_const*>::producer_ +
                                 0x10))();
  }
  if (local_50[0] == local_40) {
    return pEVar4;
  }
  operator_delete(local_50[0]);
  return pEVar4;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }